

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_wif_trace.cpp
# Opt level: O0

void __thiscall
sc_core::wif_trace_file::trace(wif_trace_file *this,uint64 *object_,string *name_,int width_)

{
  bool bVar1;
  string *wif_name_;
  uint64 *in_RDX;
  string *in_RSI;
  wif_uint64_trace *in_RDI;
  string *in_stack_00000160;
  sc_trace_file_base *in_stack_00000168;
  int width__00;
  string local_48 [32];
  wif_trace_file *in_stack_ffffffffffffffd8;
  
  bVar1 = sc_trace_file_base::add_trace_check(in_stack_00000168,in_stack_00000160);
  if (bVar1) {
    width__00 = (int)((ulong)&in_RDI[1].old_value >> 0x20);
    wif_name_ = (string *)operator_new(0x70);
    obtain_name_abi_cxx11_(in_stack_ffffffffffffffd8);
    wif_uint64_trace::wif_uint64_trace(in_RDI,in_RDX,in_RSI,wif_name_,width__00);
    std::vector<sc_core::wif_trace_*,_std::allocator<sc_core::wif_trace_*>_>::push_back
              ((vector<sc_core::wif_trace_*,_std::allocator<sc_core::wif_trace_*>_> *)in_RSI,
               (value_type *)wif_name_);
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

void
wif_trace_file::trace( const unsigned& object_,
		       const std::string& name_,
		       const char** enum_literals_ )
{
    if( add_trace_check(name_) )
        traces.push_back( new wif_enum_trace( object_,
                                              name_,
                                              obtain_name(),
                                              enum_literals_ ) );
}